

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TCPConnection.cpp
# Opt level: O3

void __thiscall TCPConnection::Write(TCPConnection *this,uint8_t *data,uint16_t length)

{
  uint16_t *puVar1;
  uint8_t uVar2;
  ushort uVar3;
  uint8_t *puVar4;
  DataBuffer *pDVar5;
  ulong uVar6;
  ulong uVar7;
  undefined6 in_register_00000012;
  ushort uVar8;
  ulong uVar9;
  
  if ((int)CONCAT62(in_register_00000012,length) != 0) {
    uVar9 = CONCAT62(in_register_00000012,length) & 0xffffffff;
    do {
      pDVar5 = this->TxBuffer;
      if (pDVar5 == (DataBuffer *)0x0) {
        pDVar5 = GetTxBuffer(this);
        this->TxBuffer = pDVar5;
        this->TxOffset = 0;
        if (pDVar5 != (DataBuffer *)0x0) goto LAB_00107ca7;
        puts("Out of tx buffers");
      }
      else {
LAB_00107ca7:
        uVar8 = (ushort)uVar9;
        if (uVar8 < pDVar5->Remainder) {
          uVar7 = 0;
          do {
            uVar2 = data[uVar7];
            puVar4 = this->TxBuffer->Packet;
            uVar3 = this->TxOffset;
            this->TxOffset = uVar3 + 1;
            puVar4[uVar3] = uVar2;
            uVar7 = uVar7 + 1;
          } while ((uVar9 & 0xffff) != uVar7);
          pDVar5 = this->TxBuffer;
          puVar1 = &pDVar5->Length;
          *puVar1 = *puVar1 + uVar8;
          puVar1 = &pDVar5->Remainder;
          *puVar1 = *puVar1 - uVar8;
          return;
        }
        if (pDVar5->Remainder == 0) {
          uVar7 = 0;
        }
        else {
          uVar6 = 0;
          do {
            uVar2 = data[uVar6];
            puVar4 = pDVar5->Packet;
            uVar8 = this->TxOffset;
            this->TxOffset = uVar8 + 1;
            puVar4[uVar8] = uVar2;
            uVar6 = uVar6 + 1;
            pDVar5 = this->TxBuffer;
            uVar7 = (ulong)pDVar5->Remainder;
          } while (uVar6 < uVar7);
        }
        pDVar5->Length = pDVar5->Length + (short)uVar7;
        uVar9 = (ulong)(uint)((int)uVar9 - (int)uVar7);
        data = data + uVar7;
        pDVar5->Remainder = 0;
        BuildPacket(this,pDVar5,'\b');
        this->TxBuffer = (DataBuffer *)0x0;
      }
    } while ((short)uVar9 != 0);
  }
  return;
}

Assistant:

void TCPConnection::Write(const uint8_t* data, uint16_t length)
{
    uint16_t i;

    while (length > 0)
    {
        if (!TxBuffer)
        {
            TxBuffer = GetTxBuffer();
            TxOffset = 0;
        }

        if (TxBuffer)
        {
            if (TxBuffer->Remainder > length)
            {
                for (i = 0; i < length; i++)
                {
                    TxBuffer->Packet[TxOffset++] = data[i];
                }
                TxBuffer->Length += length;
                TxBuffer->Remainder -= length;
                break;
            }
            else if (TxBuffer->Remainder <= length)
            {
                for (i = 0; i < TxBuffer->Remainder; i++)
                {
                    TxBuffer->Packet[TxOffset++] = data[i];
                }
                TxBuffer->Length += TxBuffer->Remainder;
                length -= TxBuffer->Remainder;
                data += TxBuffer->Remainder;
                TxBuffer->Remainder = 0;
                Flush();
            }
        }
        else
        {
            printf("Out of tx buffers\n");
        }
    }
}